

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSphericalHarmonic.cpp
# Opt level: O3

RealType __thiscall
OpenMD::RealSphericalHarmonic::LegendreP(RealSphericalHarmonic *this,int l,int m,RealType x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  RealType RVar5;
  double dVar6;
  double dVar7;
  
  if (((m < 0) || (l < m)) || (1.0 < ABS(x))) {
    printf("LegendreP got a bad argument: l = %d\tm = %d\tx = %lf\n",x,l,(ulong)(uint)m);
    RVar5 = NAN;
  }
  else {
    if (m == 0) {
      dVar6 = 1.0;
    }
    else {
      dVar4 = (x + 1.0) * (1.0 - x);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar7 = 1.0;
      dVar6 = 1.0;
      iVar2 = m;
      do {
        dVar6 = dVar6 * -dVar7 * dVar4;
        dVar7 = dVar7 + 2.0;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    RVar5 = dVar6;
    if (((l != m) && (dVar4 = (double)(m * 2 + 1) * x * dVar6, RVar5 = dVar4, m + 1 != l)) &&
       (RVar5 = 0.0, m + 2 <= l)) {
      iVar2 = m * 2 + 3;
      iVar3 = 1;
      do {
        dVar7 = dVar4;
        iVar1 = m * 2 + iVar3;
        iVar3 = iVar3 + 1;
        RVar5 = ((double)iVar2 * x * dVar7 - (double)iVar1 * dVar6) / (double)iVar3;
        iVar2 = iVar2 + 2;
        dVar4 = RVar5;
        dVar6 = dVar7;
      } while (l - m != iVar3);
    }
  }
  return RVar5;
}

Assistant:

RealType RealSphericalHarmonic::LegendreP(int l, int m, RealType x) {
  // check parameters
  if (m < 0 || m > l || fabs(x) > 1.0) {
    printf("LegendreP got a bad argument: l = %d\tm = %d\tx = %lf\n", l, m, x);
    //    return NAN;
    return std::numeric_limits<RealType>::quiet_NaN();
  }

  RealType pmm = 1.0;
  if (m > 0) {
    RealType h = sqrt((1.0 - x) * (1.0 + x)), f = 1.0;
    for (int i = 1; i <= m; i++) {
      pmm *= -f * h;
      f += 2.0;
    }
  }
  if (l == m)
    return pmm;
  else {
    RealType pmmp1 = x * (2 * m + 1) * pmm;
    if (l == (m + 1))
      return pmmp1;
    else {
      RealType pll = 0.0;
      for (int ll = m + 2; ll <= l; ll++) {
        pll   = (x * (2 * ll - 1) * pmmp1 - (ll + m - 1) * pmm) / (ll - m);
        pmm   = pmmp1;
        pmmp1 = pll;
      }
      return pll;
    }
  }
}